

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_subd_fragment.cpp
# Opt level: O2

bool ON_SubDLimitMeshSealEdgeInfo::Seal
               (ON_SubDLimitMeshSealEdgeInfo *src,ON_SubDLimitMeshSealEdgeInfo *dst)

{
  byte bVar1;
  byte bVar2;
  byte bVar3;
  ON_SubDMeshFragment *src_fragment;
  ON_SubDMeshFragment *dst_fragment;
  uint i0;
  char *sFormat;
  byte bVar4;
  byte bVar5;
  int line_number;
  uint i1;
  uint uVar6;
  uint uVar7;
  
  if (src->m_edge_id == 0) {
    return false;
  }
  if (src->m_edge_id != dst->m_edge_id) {
    return false;
  }
  src_fragment = src->m_fragment;
  if ((src_fragment == (ON_SubDMeshFragment *)0x0) ||
     (dst_fragment = dst->m_fragment, dst_fragment == (ON_SubDMeshFragment *)0x0)) {
    return false;
  }
  bVar1 = src->m_bits;
  bVar5 = dst->m_bits & 0xc0;
  bVar2 = (src_fragment->m_grid).m_side_segment_count;
  uVar7 = (uint)bVar2;
  bVar3 = (dst_fragment->m_grid).m_side_segment_count;
  uVar6 = (uint)bVar3;
  i0 = src->m_grid_side_dex * uVar7;
  i1 = i0 + uVar7;
  bVar4 = bVar1 & 1;
  if (((bVar1 & 0xc0) == bVar5) && (bVar2 == bVar3)) goto LAB_0060b8b9;
  if (((bVar1 & 0xc0) != 0) ||
     (((src->m_face_edge_count != 4 || (dst->m_face_edge_count == 4)) ||
      ((uint)bVar3 + (uint)bVar3 != uVar7)))) {
    ON_SubDIncrementErrorCount();
    sFormat = "unexpected sealing fragment portions";
    line_number = 0xd03;
LAB_0060b990:
    ON_ErrorEx("/workspace/llm4binary/github/license_c_cmakelists/mcneel[P]opennurbs/opennurbs_subd_fragment.cpp"
               ,line_number,"",sFormat);
    return false;
  }
  if (bVar5 == 0x80) {
    if (bVar4 == 0) {
LAB_0060b967:
      i0 = i0 + bVar3;
      goto LAB_0060b8b9;
    }
  }
  else {
    if (bVar5 != 0x40) {
      ON_SubDIncrementErrorCount();
      sFormat = "unexpected dst_half";
      line_number = 0xcfa;
      goto LAB_0060b990;
    }
    if (bVar4 != 0) goto LAB_0060b967;
  }
  i1 = i1 - bVar3;
LAB_0060b8b9:
  uVar7 = 0;
  if (bVar4 != (dst->m_bits & 1)) {
    uVar7 = (uint)bVar3;
    uVar6 = -(uint)bVar3;
  }
  uVar7 = uVar7 + (uint)dst->m_grid_side_dex * (uint)bVar3;
  ON_SubDMeshFragment::SealAdjacentSides
            (true,(bool)((bVar1 & 2) >> 1),src_fragment,i0,i1,dst_fragment,uVar7,uVar6 + uVar7);
  return true;
}

Assistant:

bool ON_SubDLimitMeshSealEdgeInfo::Seal(
  const ON_SubDLimitMeshSealEdgeInfo& src,
  const ON_SubDLimitMeshSealEdgeInfo& dst
)
{
  if (src.m_edge_id != dst.m_edge_id || 0 == src.m_edge_id)
    return false;
  if (nullptr == src.m_fragment || nullptr == dst.m_fragment)
    return false;
  const bool bSealNormals = (0 != (src.m_bits & ON_SubDLimitMeshSealEdgeInfo::Bits::Smooth));
  const unsigned char src_half = (src.m_bits & ON_SubDLimitMeshSealEdgeInfo::Bits::HalfMask);
  const unsigned char dst_half = (dst.m_bits & ON_SubDLimitMeshSealEdgeInfo::Bits::HalfMask);
  unsigned int src_side_segment_count = src.m_fragment->m_grid.m_side_segment_count;
  unsigned int dst_side_segment_count = dst.m_fragment->m_grid.m_side_segment_count;
  unsigned int i0 = src.m_grid_side_dex*src_side_segment_count;
  unsigned int i1 = i0 + src_side_segment_count;

  ////unsigned int vid[2] = {};
  ////const ON_SubDEdge* e = src.m_fragment->Edge(src.m_grid_side_dex);
  ////if (nullptr != e )
  ////{
  ////  const ON_SubDVertex* v = src.m_fragment->Vertex(src.m_grid_side_dex);
  ////  if ( nullptr != v )
  ////    vid[0] = v->m_id;
  ////  v = src.m_fragment->Vertex((src.m_grid_side_dex+1)%4);
  ////  if ( nullptr !=v )
  ////    vid[1] = v->m_id;
  ////}

  // src_dir = 0 if SubD edge and fragment side have compatible natural orientations
  const unsigned char src_dir = (src.m_bits&ON_SubDLimitMeshSealEdgeInfo::Bits::EdgeDir);

  if (src_half != dst_half || src_side_segment_count != dst_side_segment_count)
  {
    if (
      0 == src_half
      && 4 == src.m_face_edge_count
      && 4 != dst.m_face_edge_count
      && 2 * dst_side_segment_count == src_side_segment_count)
    {
      // The face for src_half is a quad and the face for dest_half is an N-gon with N != 3,
      // and src_fragment is a full sized fragment and dst_fragment is a half sized fragment.
      if (ON_SubDLimitMeshSealEdgeInfo::Bits::FirstHalf == dst_half)
      {
        // only copy half of src_fragment side
        if (0 == src_dir)
        {
          i1 -= dst_side_segment_count; // copy first half of src_fragment side
          ////vid[1] = 0;
        }
        else
        {
          i0 += dst_side_segment_count; // copy 2nd half of src_fragment side
          ////vid[0] = 0;
        }
      }
      else if (ON_SubDLimitMeshSealEdgeInfo::Bits::SecondHalf == dst_half)
      {
        // only copy half of src_fragment side
        if (0 == src_dir)
        {
          i0 += dst_side_segment_count; // copy 2nd half of src_fragment side
          ////vid[0] = 0;
        }
        else
        {
          i1 -= dst_side_segment_count; // copy first half of src_fragment side
          ////vid[1] = 0;
        }
      }
      else
      {
        // bug in this code or the code that sets the m_bits information.
        ON_SUBD_ERROR("unexpected dst_half");
        return false;
      }
    }
    else
    {
      // Either the parent subd is invalid or information
      // set in the fragments, or the sorting in ON_SubDMeshImpl::SealEdges()
      // is not valid (or some other bug).
      ON_SUBD_ERROR("unexpected sealing fragment portions");
      return false;
    }
  }

  // seal this edge
  const bool bSameDirection = (src_dir == (dst.m_bits&ON_SubDLimitMeshSealEdgeInfo::Bits::EdgeDir));
  const unsigned int j0 = dst.m_grid_side_dex*dst_side_segment_count + (bSameDirection?0:dst_side_segment_count);
  const unsigned int j1 = bSameDirection ? (j0+dst_side_segment_count) : (j0-dst_side_segment_count);
  ON_SubDMeshFragment::SealAdjacentSides(
    true, // bTestNearEqual,
    bSealNormals,
    *src.m_fragment,
    i0,
    i1,
    *dst.m_fragment,
    j0,
    j1
  );
  return true;
}